

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void compact_suite::fail_int16_overflow(void)

{
  size_type sVar1;
  array<short,_1UL> buffer;
  value_type input [8];
  reader reader;
  
  input[0] = 0xaa;
  input[1] = '\x06';
  input[2] = 'A';
  input[3] = '\0';
  input[4] = 'B';
  input[5] = '\0';
  input[6] = 'C';
  input[7] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[8]>(&reader,&input);
  sVar1 = trial::protocol::bintoken::reader::length(&reader);
  boost::detail::test_impl
            ("reader.length() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3d8,"void compact_suite::fail_int16_overflow()",sVar1 == 3);
  buffer._M_elems[0] = (_Type)0;
  trial::protocol::bintoken::reader::overloader<short,_void>::convert(&reader,buffer._M_elems,1);
  boost::detail::throw_failed_impl
            ("reader.array<std::int16_t>(buffer.data(), buffer.size())","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3db,"void compact_suite::fail_int16_overflow()");
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&reader.stack);
  return;
}

Assistant:

void fail_int16_overflow()
{
    const value_type input[] = {
        token::code::array8_int16, 3 * token::int16::size,
        0x41, 0x00,
        0x42, 0x00,
        0x43, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST(reader.length() == 3);
    std::array<std::int16_t, 1> buffer = {};
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array<std::int16_t>(buffer.data(), buffer.size()),
                                    format::error, "overflow");
}